

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O1

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> __thiscall
duckdb::ParseInfo::Deserialize(ParseInfo *this,Deserializer *deserializer)

{
  ParseInfoType PVar1;
  uint uVar2;
  SerializationException *this_00;
  pointer *__ptr;
  string str;
  _Alloc_hider local_48;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"info_type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&stack0xffffffffffffffb8,deserializer);
    PVar1 = EnumUtil::FromString<duckdb::ParseInfoType>(local_48._M_p);
    uVar2 = (uint)PVar1;
    if (local_48._M_p != &stack0xffffffffffffffc8) {
      operator_delete(local_48._M_p);
    }
  }
  else {
    uVar2 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  this->_vptr_ParseInfo = (_func_int **)0x0;
  switch(uVar2 & 0xff) {
  case 0:
    AlterInfo::Deserialize((AlterInfo *)&stack0xffffffffffffffb8,deserializer);
    break;
  case 1:
    AttachInfo::Deserialize((AttachInfo *)&stack0xffffffffffffffb8,deserializer);
    break;
  case 2:
    CopyInfo::Deserialize((CopyInfo *)&stack0xffffffffffffffb8,deserializer);
    break;
  default:
    this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
    local_48._M_p = &stack0xffffffffffffffc8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffffb8,
               "Unsupported type for deserialization of ParseInfo!","");
    SerializationException::SerializationException(this_00,(string *)&stack0xffffffffffffffb8);
    __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  case 5:
    DetachInfo::Deserialize((DetachInfo *)&stack0xffffffffffffffb8,deserializer);
    break;
  case 6:
    DropInfo::Deserialize((DropInfo *)&stack0xffffffffffffffb8,deserializer);
    break;
  case 7:
    BoundExportData::Deserialize((BoundExportData *)&stack0xffffffffffffffb8,deserializer);
    break;
  case 8:
    LoadInfo::Deserialize((LoadInfo *)&stack0xffffffffffffffb8,deserializer);
    break;
  case 9:
    PragmaInfo::Deserialize((PragmaInfo *)&stack0xffffffffffffffb8,deserializer);
    break;
  case 0xb:
    TransactionInfo::Deserialize((TransactionInfo *)&stack0xffffffffffffffb8,deserializer);
    break;
  case 0xc:
    VacuumInfo::Deserialize((VacuumInfo *)&stack0xffffffffffffffb8,deserializer);
    break;
  case 0xf:
    CopyDatabaseInfo::Deserialize((CopyDatabaseInfo *)&stack0xffffffffffffffb8,deserializer);
    break;
  case 0x10:
    UpdateExtensionsInfo::Deserialize((UpdateExtensionsInfo *)&stack0xffffffffffffffb8,deserializer)
    ;
  }
  this->_vptr_ParseInfo = (_func_int **)local_48._M_p;
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)this;
}

Assistant:

unique_ptr<ParseInfo> ParseInfo::Deserialize(Deserializer &deserializer) {
	auto info_type = deserializer.ReadProperty<ParseInfoType>(100, "info_type");
	unique_ptr<ParseInfo> result;
	switch (info_type) {
	case ParseInfoType::ALTER_INFO:
		result = AlterInfo::Deserialize(deserializer);
		break;
	case ParseInfoType::ATTACH_INFO:
		result = AttachInfo::Deserialize(deserializer);
		break;
	case ParseInfoType::BOUND_EXPORT_DATA:
		result = BoundExportData::Deserialize(deserializer);
		break;
	case ParseInfoType::COPY_DATABASE_INFO:
		result = CopyDatabaseInfo::Deserialize(deserializer);
		break;
	case ParseInfoType::COPY_INFO:
		result = CopyInfo::Deserialize(deserializer);
		break;
	case ParseInfoType::DETACH_INFO:
		result = DetachInfo::Deserialize(deserializer);
		break;
	case ParseInfoType::DROP_INFO:
		result = DropInfo::Deserialize(deserializer);
		break;
	case ParseInfoType::LOAD_INFO:
		result = LoadInfo::Deserialize(deserializer);
		break;
	case ParseInfoType::PRAGMA_INFO:
		result = PragmaInfo::Deserialize(deserializer);
		break;
	case ParseInfoType::TRANSACTION_INFO:
		result = TransactionInfo::Deserialize(deserializer);
		break;
	case ParseInfoType::UPDATE_EXTENSIONS_INFO:
		result = UpdateExtensionsInfo::Deserialize(deserializer);
		break;
	case ParseInfoType::VACUUM_INFO:
		result = VacuumInfo::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of ParseInfo!");
	}
	return result;
}